

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-player.c
# Opt level: O2

panel * get_panel_skills(void)

{
  uint uVar1;
  wchar_t wVar2;
  uint8_t attr;
  panel *p;
  long lVar3;
  ulong uVar4;
  wchar_t wVar5;
  int iVar6;
  int iVar7;
  char *pcVar8;
  ulong uVar9;
  ulong uVar10;
  wchar_t tmp;
  
  p = panel_allocate(L'\b');
  iVar6 = 0;
  if (cave != (chunk_conflict *)0x0) {
    iVar6 = cave->depth / 5;
  }
  iVar7 = (player->state).skills[3];
  if (iVar7 < 1) {
    iVar7 = 0;
  }
  if (99 < iVar7) {
    iVar7 = 100;
  }
  panel_line(p,"\x04\x04\x04\f\x03\v\v\x05\x05\r\x0e"[(byte)(((ushort)iVar7 & 0xff) / 10)],
             "Saving Throw","%d%%");
  uVar1 = (player->state).skills[5];
  lVar3 = (long)(int)uVar1;
  if (lVar3 < 0) {
    pcVar8 = "Very Bad";
    attr = '\x04';
  }
  else if (uVar1 < 0x12) {
    attr = (&DAT_00268c7f)[lVar3];
    pcVar8 = &DAT_00268c94 + *(int *)(&DAT_00268c94 + lVar3 * 4);
  }
  else {
    pcVar8 = "Legendary";
    attr = '\r';
  }
  panel_line(p,attr,"Stealth","%s",pcVar8);
  iVar7 = (player->state).skills[0] - iVar6;
  if (iVar7 < 3) {
    iVar7 = 2;
  }
  if (99 < iVar7) {
    iVar7 = 100;
  }
  panel_line(p,"\x04\x04\x04\f\x03\v\v\x05\x05\r\x0e"[(byte)(((ushort)iVar7 & 0xff) / 10)],
             "Disarm - phys.","%d%%");
  iVar6 = (player->state).skills[1] - iVar6;
  if (iVar6 < 3) {
    iVar6 = 2;
  }
  if (99 < iVar6) {
    iVar6 = 100;
  }
  panel_line(p,"\x04\x04\x04\f\x03\v\v\x05\x05\r\x0e"[(byte)(((ushort)iVar6 & 0xff) / 10)],
             "Disarm - magic","%d%%");
  panel_line(p,"\x04\x04\x04\f\x03\v\v\x05\x05\r\x0e"[(player->state).skills[2] / 0xd],
             "Magic Devices","%d");
  iVar6 = (player->state).skills[4];
  iVar7 = 0;
  if (0 < iVar6) {
    iVar7 = iVar6;
  }
  if (99 < iVar7) {
    iVar7 = 100;
  }
  panel_line(p,"\x04\x04\x04\f\x03\v\v\x05\x05\r\x0e"[(byte)(((ushort)iVar7 & 0xff) / 10)],
             "Searching","%d%%");
  panel_line(p,'\r',"Infravision","%d ft",(ulong)(uint)((player->state).see_infra * 10));
  wVar2 = (player->state).speed;
  wVar5 = wVar2 + L'\xfffffff6';
  if (*player->timed == 0) {
    wVar5 = wVar2;
  }
  wVar2 = wVar5 + L'\n';
  if (player->timed[1] == 0) {
    wVar2 = wVar5;
  }
  if (wVar2 == L'n') {
    pcVar8 = "Normal";
  }
  else {
    uVar9 = (ulong)("\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x03\x03\x03\x03\x03\x03\x03\x03\x04\x04\x04\x04\x04\x05\x05\x05\x05\x06\x06\a\a\b\t\n\v\f\r\x0e\x0f\x10\x11\x12\x13\x14\x15\x16\x17\x18\x19\x1a\x1b\x1c\x1d\x1e\x1f !\"#$$%%&&\'\'((()))***+++,,,,-----...../////0000011111111111111111111"
                    [wVar2] / '\n');
    uVar10 = (ulong)(ushort)((((uint)"\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x03\x03\x03\x03\x03\x03\x03\x03\x04\x04\x04\x04\x04\x05\x05\x05\x05\x06\x06\a\a\b\t\n\v\f\r\x0e\x0f\x10\x11\x12\x13\x14\x15\x16\x17\x18\x19\x1a\x1b\x1c\x1d\x1e\x1f !\"#$$%%&&\'\'((()))***+++,,,,-----...../////0000011111111111111111111"
                                     [wVar2] * 10) / 10) % 10);
    if ((player->opts).opt[0x15] == true) {
      pcVar8 = "%d.%dx (%d)";
      uVar4 = uVar9;
      uVar9 = uVar10;
      uVar10 = (ulong)(uint)(wVar2 + L'\xffffff92');
    }
    else {
      pcVar8 = "%d (%d.%dx)";
      uVar4 = (ulong)(uint)(wVar2 + L'\xffffff92');
    }
    strnfmt(show_speed_buffer,10,pcVar8,uVar4,uVar9,uVar10);
    pcVar8 = show_speed_buffer;
  }
  panel_line(p,(wVar2 < L'n') * '\x02' + '\r',"Speed","%s",pcVar8);
  return p;
}

Assistant:

static struct panel *get_panel_skills(void) {
	struct panel *p = panel_allocate(8);

	int skill;
	uint8_t attr;
	const char *desc;
	int depth = cave ? cave->depth : 0;

#define BOUND(x, min, max)		MIN(max, MAX(min, x))

	/* Saving throw */
	skill = BOUND(player->state.skills[SKILL_SAVE], 0, 100);
	panel_line(p, colour_table[skill / 10], "Saving Throw", "%d%%", skill);

	/* Stealth */
	desc = likert(player->state.skills[SKILL_STEALTH], 1, &attr);
	panel_line(p, attr, "Stealth", "%s", desc);

	/* Physical disarming: assume we're disarming a dungeon trap */
	skill = BOUND(player->state.skills[SKILL_DISARM_PHYS] - depth / 5, 2, 100);
	panel_line(p, colour_table[skill / 10], "Disarm - phys.", "%d%%", skill);

	/* Magical disarming */
	skill = BOUND(player->state.skills[SKILL_DISARM_MAGIC] - depth / 5, 2, 100);
	panel_line(p, colour_table[skill / 10], "Disarm - magic", "%d%%", skill);

	/* Magic devices */
	skill = player->state.skills[SKILL_DEVICE];
	panel_line(p, colour_table[skill / 13], "Magic Devices", "%d", skill);

	/* Searching ability */
	skill = BOUND(player->state.skills[SKILL_SEARCH], 0, 100);
	panel_line(p, colour_table[skill / 10], "Searching", "%d%%", skill);

	/* Infravision */
	panel_line(p, COLOUR_L_GREEN, "Infravision", "%d ft",
			player->state.see_infra * 10);

	/* Speed */
	skill = player->state.speed;
	if (player->timed[TMD_FAST]) skill -= 10;
	if (player->timed[TMD_SLOW]) skill += 10;
	attr = skill < 110 ? COLOUR_L_UMBER : COLOUR_L_GREEN;
	panel_line(p, attr, "Speed", "%s", show_speed());

	return p;
}